

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O1

void PKCS7_free(PKCS7 *a)

{
  if (a != (PKCS7 *)0x0) {
    OPENSSL_free(a->asn1);
    ASN1_OBJECT_free(*(ASN1_OBJECT **)&a->state);
    if (a->type != (ASN1_OBJECT *)0x0) {
      OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)a->type->sn,sk_X509_call_free_func,X509_free);
      OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)a->type->ln,sk_X509_CRL_call_free_func,X509_CRL_free);
      OPENSSL_free(a->type);
    }
    OPENSSL_free(a);
    return;
  }
  return;
}

Assistant:

void PKCS7_free(PKCS7 *p7) {
  if (p7 == NULL) {
    return;
  }

  OPENSSL_free(p7->ber_bytes);
  ASN1_OBJECT_free(p7->type);
  // We only supported signed data.
  if (p7->d.sign != NULL) {
    sk_X509_pop_free(p7->d.sign->cert, X509_free);
    sk_X509_CRL_pop_free(p7->d.sign->crl, X509_CRL_free);
    OPENSSL_free(p7->d.sign);
  }
  OPENSSL_free(p7);
}